

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_ge_set_xy(secp256k1_ge *r,secp256k1_fe *x,secp256k1_fe *y)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  int iVar6;
  
  secp256k1_fe_verify(x);
  secp256k1_fe_verify(y);
  r->infinity = 0;
  uVar1 = x->n[1];
  uVar2 = x->n[2];
  uVar3 = x->n[3];
  uVar4 = x->n[4];
  iVar5 = x->magnitude;
  iVar6 = x->normalized;
  (r->x).n[0] = x->n[0];
  (r->x).n[1] = uVar1;
  (r->x).n[2] = uVar2;
  (r->x).n[3] = uVar3;
  (r->x).n[4] = uVar4;
  (r->x).magnitude = iVar5;
  (r->x).normalized = iVar6;
  uVar1 = y->n[1];
  uVar2 = y->n[2];
  uVar3 = y->n[3];
  uVar4 = y->n[4];
  iVar5 = y->magnitude;
  iVar6 = y->normalized;
  (r->y).n[0] = y->n[0];
  (r->y).n[1] = uVar1;
  (r->y).n[2] = uVar2;
  (r->y).n[3] = uVar3;
  (r->y).n[4] = uVar4;
  (r->y).magnitude = iVar5;
  (r->y).normalized = iVar6;
  secp256k1_ge_verify(r);
  return;
}

Assistant:

static void secp256k1_ge_set_xy(secp256k1_ge *r, const secp256k1_fe *x, const secp256k1_fe *y) {
    secp256k1_fe_verify(x);
    secp256k1_fe_verify(y);
    r->infinity = 0;
    r->x = *x;
    r->y = *y;
    secp256k1_ge_verify(r);
}